

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::btMultiBody
          (btMultiBody *this,int n_links,btScalar mass,btVector3 *inertia,bool fixedBase,
          bool canSleep,bool param_7)

{
  undefined8 uVar1;
  int in_ECX;
  btAlignedObjectArray<btMultibodyLink> *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  byte in_R8B;
  byte in_R9B;
  undefined4 in_XMM0_Da;
  btScalar *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  btScalar *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  int newsize;
  btAlignedObjectArray<btMatrix3x3> *this_00;
  btMultibodyLink *fillData;
  btScalar local_2e8;
  btScalar local_2e4;
  btScalar local_2e0;
  btScalar local_2dc;
  btScalar local_2d8;
  btScalar local_2d4 [5];
  btMultibodyLink *in_stack_fffffffffffffd40;
  btScalar local_28;
  btScalar local_24;
  btScalar local_20;
  byte local_1b;
  byte local_1a;
  byte local_19;
  btAlignedObjectArray<btMultibodyLink> *local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_19 = (byte)in_ECX & 1;
  local_1a = in_R8B & 1;
  local_1b = in_R9B & 1;
  *in_RDI = &PTR__btMultiBody_002e7d18;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  local_20 = 0.0;
  local_24 = 0.0;
  local_28 = 0.0;
  local_18 = in_RDX;
  local_10 = in_XMM0_Da;
  local_c = in_ESI;
  btVector3::btVector3((btVector3 *)(in_RDI + 3),&local_20,&local_24,&local_28);
  btQuaternion::btQuaternion
            ((btQuaternion *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8,
             (btScalar *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
             in_stack_fffffffffffffca8,(btScalar *)0x237357);
  *(undefined4 *)(in_RDI + 7) = local_10;
  uVar1 = *(undefined8 *)&local_18->m_capacity;
  *(undefined8 *)((long)in_RDI + 0x3c) = *(undefined8 *)local_18;
  *(undefined8 *)((long)in_RDI + 0x44) = uVar1;
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x4c));
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x5c));
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x6c));
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x7c));
  btAlignedObjectArray<btMultibodyLink>::btAlignedObjectArray
            ((btAlignedObjectArray<btMultibodyLink> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  btAlignedObjectArray<btMultiBodyLinkCollider_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btMultiBodyLinkCollider_*> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  fillData = (btMultibodyLink *)(in_RDI + 0x1a);
  btAlignedObjectArray<float>::btAlignedObjectArray
            ((btAlignedObjectArray<float> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  btAlignedObjectArray<float>::btAlignedObjectArray
            ((btAlignedObjectArray<float> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  this_00 = (btAlignedObjectArray<btMatrix3x3> *)(in_RDI + 0x22);
  btAlignedObjectArray<btVector3>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  newsize = (int)((ulong)(in_RDI + 0x26) >> 0x20);
  btAlignedObjectArray<btMatrix3x3>::btAlignedObjectArray
            ((btAlignedObjectArray<btMatrix3x3> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  btMatrix3x3::btMatrix3x3
            ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  btMatrix3x3::btMatrix3x3
            ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  btMatrix3x3::btMatrix3x3
            ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  btMatrix3x3::btMatrix3x3
            ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  *(byte *)(in_RDI + 0x42) = local_19 & 1;
  *(undefined1 *)((long)in_RDI + 0x211) = 1;
  *(byte *)((long)in_RDI + 0x212) = local_1a & 1;
  *(undefined4 *)((long)in_RDI + 0x214) = 0;
  *(undefined4 *)((long)in_RDI + 0x21c) = 0x3d23d70a;
  *(undefined4 *)(in_RDI + 0x44) = 0x3d23d70a;
  *(undefined1 *)((long)in_RDI + 0x224) = 1;
  *(undefined4 *)(in_RDI + 0x45) = 0x447a0000;
  *(undefined4 *)((long)in_RDI + 0x22c) = 0x42c80000;
  *(undefined1 *)(in_RDI + 0x46) = 1;
  *(undefined1 *)((long)in_RDI + 0x231) = 0;
  *(undefined4 *)((long)in_RDI + 0x234) = 0;
  *(undefined4 *)(in_RDI + 0x47) = 0;
  *(undefined1 *)((long)in_RDI + 0x23c) = 0;
  *(undefined1 *)((long)in_RDI + 0x23d) = 0;
  *(undefined1 *)((long)in_RDI + 0x23e) = 0;
  btMultibodyLink::btMultibodyLink(in_stack_fffffffffffffd40);
  btAlignedObjectArray<btMultibodyLink>::resize(in_RDX,in_ECX,fillData);
  btMatrix3x3::btMatrix3x3((btMatrix3x3 *)CONCAT44(local_c,in_stack_fffffffffffffcc0));
  btAlignedObjectArray<btMatrix3x3>::resize
            (this_00,newsize,(btMatrix3x3 *)CONCAT44(local_c,in_stack_fffffffffffffcc0));
  local_2d4[0] = 0.0;
  local_2d8 = 0.0;
  local_2dc = 0.0;
  btVector3::setValue((btVector3 *)((long)in_RDI + 0x4c),local_2d4,&local_2d8,&local_2dc);
  local_2e0 = 0.0;
  local_2e4 = 0.0;
  local_2e8 = 0.0;
  btVector3::setValue((btVector3 *)((long)in_RDI + 0x5c),&local_2e0,&local_2e4,&local_2e8);
  return;
}

Assistant:

btMultiBody::btMultiBody(int n_links,
                     btScalar mass,
                     const btVector3 &inertia,
                     bool fixedBase,
                     bool canSleep,
		     bool /*deprecatedUseMultiDof*/)
    : 
    	m_baseCollider(0),
		m_baseName(0),
    	m_basePos(0,0,0),
    	m_baseQuat(0, 0, 0, 1),
      m_baseMass(mass),
      m_baseInertia(inertia),
    
		m_fixedBase(fixedBase),
		m_awake(true),
		m_canSleep(canSleep),
		m_sleepTimer(0),
		
		m_linearDamping(0.04f),
		m_angularDamping(0.04f),
		m_useGyroTerm(true),
			m_maxAppliedImpulse(1000.f),
		m_maxCoordinateVelocity(100.f),
			m_hasSelfCollision(true),		
		__posUpdated(false),
			m_dofCount(0),
		m_posVarCnt(0),
		m_useRK4(false), 	
		m_useGlobalVelocities(false),
		m_internalNeedsJointFeedback(false)
{
	m_links.resize(n_links);
	m_matrixBuf.resize(n_links + 1);


    m_baseForce.setValue(0, 0, 0);
    m_baseTorque.setValue(0, 0, 0);
}